

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctor.hpp
# Opt level: O1

void __thiscall
njoy::ENDFtk::section::Type<14>::
AngularDistributions<njoy::ENDFtk::section::Type<14>::LegendreCoefficients>::
AngularDistributions<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
          (AngularDistributions<njoy::ENDFtk::section::Type<14>::LegendreCoefficients> *this,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *begin,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *end,long *lineNumber,int MAT,int MF,int MT)

{
  undefined4 in_register_00000084;
  int in_stack_ffffffffffffff70;
  InterpolationSequenceRecord<njoy::ENDFtk::section::Type<14>::LegendreCoefficients> local_88;
  
  readInterpolationSequenceRecord<njoy::ENDFtk::section::Type<14>::LegendreCoefficients,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            (&local_88,(ENDFtk *)begin,end,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)lineNumber,(long *)CONCAT44(in_register_00000084,MAT),MF,MT,
             in_stack_ffffffffffffff70);
  *(_Head_base<5UL,_long,_false> *)
   &(this->super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<14>::LegendreCoefficients>)
    .interpolation_.super_InterpolationBase.metadata.fields.
    super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
    super__Tuple_impl<1UL,_double,_long,_long,_long,_long> =
       local_88.interpolation_.super_InterpolationBase.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
       super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.
       super__Head_base<5UL,_long,_false>._M_head_impl;
  ((_Head_base<4UL,_long,_false> *)
  ((long)&(this->
          super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<14>::LegendreCoefficients>).
          interpolation_.super_InterpolationBase.metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long> + 8))->_M_head_impl =
       local_88.interpolation_.super_InterpolationBase.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
       super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl;
  ((_Head_base<3UL,_long,_false> *)
  ((long)&(this->
          super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<14>::LegendreCoefficients>).
          interpolation_.super_InterpolationBase.metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long> + 0x10))->_M_head_impl =
       local_88.interpolation_.super_InterpolationBase.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
       super__Head_base<3UL,_long,_false>._M_head_impl;
  ((_Head_base<2UL,_long,_false> *)
  ((long)&(this->
          super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<14>::LegendreCoefficients>).
          interpolation_.super_InterpolationBase.metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long> + 0x18))->_M_head_impl =
       local_88.interpolation_.super_InterpolationBase.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
       _M_head_impl;
  ((_Head_base<1UL,_double,_false> *)
  ((long)&(this->
          super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<14>::LegendreCoefficients>).
          interpolation_.super_InterpolationBase.metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long> + 0x20))->_M_head_impl =
       local_88.interpolation_.super_InterpolationBase.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
       _M_head_impl;
  (this->super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<14>::LegendreCoefficients>).
  interpolation_.super_InterpolationBase.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Head_base<0UL,_double,_false>._M_head_impl =
       local_88.interpolation_.super_InterpolationBase.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Head_base<0UL,_double,_false>._M_head_impl;
  (this->super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<14>::LegendreCoefficients>).
  interpolation_.super_InterpolationBase.boundaryIndices.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
       local_88.interpolation_.super_InterpolationBase.boundaryIndices.
       super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
  *(pointer *)
   ((long)&(this->
           super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<14>::LegendreCoefficients>)
           .interpolation_.super_InterpolationBase.boundaryIndices.
           super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data + 8) =
       local_88.interpolation_.super_InterpolationBase.boundaryIndices.
       super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish;
  *(pointer *)
   ((long)&(this->
           super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<14>::LegendreCoefficients>)
           .interpolation_.super_InterpolationBase.boundaryIndices.
           super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data + 0x10) =
       local_88.interpolation_.super_InterpolationBase.boundaryIndices.
       super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  local_88.interpolation_.super_InterpolationBase.boundaryIndices.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)0x0;
  local_88.interpolation_.super_InterpolationBase.boundaryIndices.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_88.interpolation_.super_InterpolationBase.boundaryIndices.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (this->super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<14>::LegendreCoefficients>).
  interpolation_.super_InterpolationBase.interpolationSchemeIndices.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
       local_88.interpolation_.super_InterpolationBase.interpolationSchemeIndices.
       super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
  *(pointer *)
   ((long)&(this->
           super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<14>::LegendreCoefficients>)
           .interpolation_.super_InterpolationBase.interpolationSchemeIndices.
           super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data + 8) =
       local_88.interpolation_.super_InterpolationBase.interpolationSchemeIndices.
       super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish;
  *(pointer *)
   ((long)&(this->
           super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<14>::LegendreCoefficients>)
           .interpolation_.super_InterpolationBase.interpolationSchemeIndices.
           super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data + 0x10) =
       local_88.interpolation_.super_InterpolationBase.interpolationSchemeIndices.
       super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  local_88.interpolation_.super_InterpolationBase.interpolationSchemeIndices.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)0x0;
  local_88.interpolation_.super_InterpolationBase.interpolationSchemeIndices.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_88.interpolation_.super_InterpolationBase.interpolationSchemeIndices.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (this->super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<14>::LegendreCoefficients>).
  sequence_.
  super__Vector_base<njoy::ENDFtk::section::Type<14>::LegendreCoefficients,_std::allocator<njoy::ENDFtk::section::Type<14>::LegendreCoefficients>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_88.sequence_.
       super__Vector_base<njoy::ENDFtk::section::Type<14>::LegendreCoefficients,_std::allocator<njoy::ENDFtk::section::Type<14>::LegendreCoefficients>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<14>::LegendreCoefficients>).
  sequence_.
  super__Vector_base<njoy::ENDFtk::section::Type<14>::LegendreCoefficients,_std::allocator<njoy::ENDFtk::section::Type<14>::LegendreCoefficients>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_88.sequence_.
       super__Vector_base<njoy::ENDFtk::section::Type<14>::LegendreCoefficients,_std::allocator<njoy::ENDFtk::section::Type<14>::LegendreCoefficients>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (this->super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<14>::LegendreCoefficients>).
  sequence_.
  super__Vector_base<njoy::ENDFtk::section::Type<14>::LegendreCoefficients,_std::allocator<njoy::ENDFtk::section::Type<14>::LegendreCoefficients>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_88.sequence_.
       super__Vector_base<njoy::ENDFtk::section::Type<14>::LegendreCoefficients,_std::allocator<njoy::ENDFtk::section::Type<14>::LegendreCoefficients>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_88.sequence_.
  super__Vector_base<njoy::ENDFtk::section::Type<14>::LegendreCoefficients,_std::allocator<njoy::ENDFtk::section::Type<14>::LegendreCoefficients>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.sequence_.
  super__Vector_base<njoy::ENDFtk::section::Type<14>::LegendreCoefficients,_std::allocator<njoy::ENDFtk::section::Type<14>::LegendreCoefficients>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.sequence_.
  super__Vector_base<njoy::ENDFtk::section::Type<14>::LegendreCoefficients,_std::allocator<njoy::ENDFtk::section::Type<14>::LegendreCoefficients>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  vector<njoy::ENDFtk::section::Type<14>::LegendreCoefficients,_std::allocator<njoy::ENDFtk::section::Type<14>::LegendreCoefficients>_>
  ::~vector(&local_88.sequence_);
  if (local_88.interpolation_.super_InterpolationBase.interpolationSchemeIndices.
      super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start !=
      (pointer)0x0) {
    operator_delete(local_88.interpolation_.super_InterpolationBase.interpolationSchemeIndices.
                    super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                    _M_start,(long)local_88.interpolation_.super_InterpolationBase.
                                   interpolationSchemeIndices.
                                   super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage -
                             (long)local_88.interpolation_.super_InterpolationBase.
                                   interpolationSchemeIndices.
                                   super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                   super__Vector_impl_data._M_start);
  }
  if (local_88.interpolation_.super_InterpolationBase.boundaryIndices.
      super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start !=
      (pointer)0x0) {
    operator_delete(local_88.interpolation_.super_InterpolationBase.boundaryIndices.
                    super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                    _M_start,(long)local_88.interpolation_.super_InterpolationBase.boundaryIndices.
                                   super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage -
                             (long)local_88.interpolation_.super_InterpolationBase.boundaryIndices.
                                   super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                   super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

AngularDistributions( Iterator& begin,
                      const Iterator& end,
                      long& lineNumber,
                      int MAT,
                      int MF,
                      int MT ) :
  InterpolationSequenceRecord< Records >(
    readInterpolationSequenceRecord< Records >( begin, end, lineNumber,
                                                MAT, MF, MT ) ) {}